

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_color nk_hsv(int h,int s,int v)

{
  int iVar1;
  nk_color nVar2;
  
  if (0xfe < h) {
    h = 0xff;
  }
  if (h < 1) {
    h = 0;
  }
  if (0xfe < s) {
    s = 0xff;
  }
  if (s < 1) {
    s = 0;
  }
  iVar1 = 0xff;
  if (v < 0xff) {
    iVar1 = v;
  }
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  nVar2 = nk_hsva_f((float)h / 255.0,(float)s / 255.0,(float)iVar1 / 255.0,1.0);
  return nVar2;
}

Assistant:

NK_API struct nk_color
nk_hsv(int h, int s, int v)
{
    return nk_hsva(h, s, v, 255);
}